

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::config::glInitLayered
               (TextureLayered *cfg,GLint depth_divider,Functions *gl)

{
  glTexImage3DFunc p_Var1;
  GLenum GVar2;
  TransferFormat TVar3;
  int local_40;
  int local_3c;
  GLint level;
  GLint depth;
  GLint h;
  GLint w;
  TransferFormat format;
  Functions *gl_local;
  GLint depth_divider_local;
  TextureLayered *cfg_local;
  
  TVar3 = transferImageFormat(&(cfg->super_Texture).super_Image.internalFormat);
  depth = (cfg->super_Texture).super_Image.width;
  level = (cfg->super_Texture).super_Image.height;
  local_3c = *(int *)&(cfg->super_Texture).field_0x1c;
  for (local_40 = 0; local_40 < (cfg->super_Texture).numLevels; local_40 = local_40 + 1) {
    p_Var1 = gl->texImage3D;
    GVar2 = glTarget((Image *)cfg);
    h = TVar3.format;
    w = TVar3.dataType;
    (*p_Var1)(GVar2,local_40,(cfg->super_Texture).super_Image.internalFormat.format,depth,level,
              local_3c,0,h,w,(void *)0x0);
    depth = de::max<int>(1,depth / 2);
    level = de::max<int>(1,level / 2);
    local_3c = de::max<int>(1,local_3c / depth_divider);
  }
  return;
}

Assistant:

static void glInitLayered (const TextureLayered& cfg,
						   GLint depth_divider, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	GLint depth = cfg.numLayers;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage3D(glTarget(cfg), level, cfg.internalFormat.format, w, h, depth, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
		depth = de::max(1, depth / depth_divider);
	}
}